

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arm.cpp
# Opt level: O1

bool ArmGetRlist(char *source,int *RetLen,int ValidRegisters,int *Result)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  char cVar6;
  int i;
  uint uVar7;
  bool bVar8;
  
  uVar7 = 0;
  uVar4 = 0;
  do {
    uVar2 = ArmGetRegister(source + (int)uVar4,RetLen);
    if (uVar2 == 0xffffffff) {
      cVar6 = '\x01';
    }
    else {
      uVar4 = (long)*RetLen + (long)(int)uVar4;
      if (source[uVar4] == '-') {
        iVar3 = ArmGetRegister(source + uVar4 + 1,RetLen);
        bVar1 = false;
        cVar6 = '\x01';
        if ((iVar3 != -1) && ((int)uVar2 <= iVar3)) {
          uVar4 = (ulong)((int)uVar4 + *RetLen + 1);
          do {
            uVar5 = 1 << ((byte)uVar2 & 0x1f);
            cVar6 = '\x01';
            bVar8 = (uVar5 & ValidRegisters) == 0;
            bVar1 = !bVar8;
            if (bVar8) goto LAB_00143a40;
            uVar7 = uVar7 | uVar5;
            uVar2 = uVar2 + 1;
          } while (iVar3 + 1U != uVar2);
          cVar6 = '\0';
        }
LAB_00143a40:
        if (bVar1) {
LAB_00143a44:
          iVar3 = (int)uVar4;
          uVar4 = (ulong)(iVar3 + (uint)(source[iVar3] == ','));
          cVar6 = (source[iVar3] != ',') * '\x03';
        }
      }
      else {
        cVar6 = '\x01';
        if (((uint)ValidRegisters >> (uVar2 & 0x1f) & 1) != 0) {
          uVar7 = uVar7 | 1 << ((byte)uVar2 & 0x1f);
          goto LAB_00143a44;
        }
      }
    }
    if (cVar6 != '\0') {
      if (cVar6 == '\x03') {
        *RetLen = (int)uVar4;
        *Result = uVar7;
      }
      return cVar6 == '\x03';
    }
  } while( true );
}

Assistant:

bool ArmGetRlist(char* source, int& RetLen, int ValidRegisters, int& Result)
{
	int len = 0;

	int list = 0;
	while (true)
	{
		int num = ArmGetRegister(&source[len],RetLen);
		if (num == -1) return false;
		len += RetLen;

		if (source[len] == '-')
		{
			int num2 = ArmGetRegister(&source[len+1],RetLen);
			if (num2 == -1 || num2 < num) return false;
			len += (RetLen+1);
			for (int i = num; i <= num2; i++)
			{
				if ((ValidRegisters & (1 << i)) == 0) return false;
				list |= (1 << i);
			}
		} else {
			if ((ValidRegisters & (1 << num)) == 0) return false;
			list |= (1 << num);
		}
		if (source[len] != ',') break;
		len++;
	}

	RetLen = len;
	Result = list;
	return true;
}